

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_progress.c
# Opt level: O1

_Bool progress_meter(GlobalConfig *global,timeval *start,_Bool final)

{
  FILE *pFVar1;
  byte bVar2;
  timeval tVar3;
  byte bVar4;
  _Bool _Var5;
  long lVar6;
  per_transfer *ppVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  curl_off_t cVar11;
  curl_off_t cVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  curl_off_t cVar16;
  long lVar17;
  curl_off_t cVar18;
  timeval newer;
  timeval older;
  char ulpercen [4];
  char dlpercen [4];
  char time_total [10];
  char time_left [10];
  char buffer [3] [6];
  char time_spent [10];
  
  if (global->noprogress == false) {
    newer = tvnow();
    older.tv_usec = progress_meter_stamp_1;
    older.tv_sec = progress_meter_stamp_0;
    lVar6 = tvdiff(newer,older);
    if (progress_meter_header == '\0') {
      progress_meter_header = '\x01';
      fputs("DL% UL%  Dled  Uled  Xfers  Live   Qd Total     Current  Left    Speed\n",
            (FILE *)global->errors);
    }
    if ((final) || (500 < lVar6)) {
      lVar6 = tvdiff(newer,*start);
      dlpercen[0] = '-';
      dlpercen[1] = '-';
      dlpercen[2] = '\0';
      dlpercen[3] = '\0';
      ulpercen[0] = '-';
      ulpercen[1] = '-';
      ulpercen[2] = '\0';
      ulpercen[3] = '\0';
      cVar16 = all_dlalready;
      cVar18 = all_ulalready;
      tVar3 = newer;
      if (transfers == (per_transfer *)0x0) {
        bVar4 = 1;
        lVar15 = 0;
        bVar2 = 1;
        lVar17 = 0;
      }
      else {
        bVar2 = 1;
        lVar17 = 0;
        lVar15 = 0;
        bVar4 = 1;
        ppVar7 = transfers;
        cVar11 = all_ultotal;
        cVar12 = all_dltotal;
        do {
          progress_meter_stamp_1 = tVar3.tv_usec;
          progress_meter_stamp_0 = tVar3.tv_sec;
          if (ppVar7->dltotal == 0) {
            bVar4 = 0;
          }
          else if (ppVar7->dltotal_added == false) {
            cVar12 = cVar12 + ppVar7->dltotal;
            all_dltotal = cVar12;
            ppVar7->dltotal_added = true;
            tVar3.tv_usec = progress_meter_stamp_1;
            tVar3.tv_sec = progress_meter_stamp_0;
          }
          progress_meter_stamp_1 = tVar3.tv_usec;
          progress_meter_stamp_0 = tVar3.tv_sec;
          if (ppVar7->ultotal == 0) {
            bVar2 = 0;
          }
          else if (ppVar7->ultotal_added == false) {
            cVar11 = cVar11 + ppVar7->ultotal;
            all_ultotal = cVar11;
            ppVar7->ultotal_added = true;
            tVar3.tv_usec = progress_meter_stamp_1;
            tVar3.tv_sec = progress_meter_stamp_0;
          }
          cVar16 = cVar16 + ppVar7->dlnow;
          cVar18 = cVar18 + ppVar7->ulnow;
          lVar15 = lVar15 + (ulong)ppVar7->added;
          lVar17 = lVar17 + ((ulong)ppVar7->added ^ 1);
          ppVar7 = ppVar7->next;
        } while (ppVar7 != (per_transfer *)0x0);
      }
      progress_meter_stamp_1 = tVar3.tv_usec;
      progress_meter_stamp_0 = tVar3.tv_sec;
      if ((bool)(all_dltotal != 0 & bVar4)) {
        curl_msnprintf(dlpercen,4,"%3d",(cVar16 * 100) / all_dltotal);
        tVar3.tv_usec = progress_meter_stamp_1;
        tVar3.tv_sec = progress_meter_stamp_0;
      }
      progress_meter_stamp_1 = tVar3.tv_usec;
      progress_meter_stamp_0 = tVar3.tv_sec;
      if ((bool)(bVar2 & all_ultotal != 0)) {
        curl_msnprintf(ulpercen,4,"%3d",(cVar18 * 100) / all_ultotal);
        tVar3.tv_usec = progress_meter_stamp_1;
        tVar3.tv_sec = progress_meter_stamp_0;
      }
      progress_meter_stamp_1 = tVar3.tv_usec;
      progress_meter_stamp_0 = tVar3.tv_sec;
      uVar8 = (ulong)speedindex;
      speedindex = speedindex + 1;
      speedstore[uVar8].dl = cVar16;
      speedstore[uVar8].ul = cVar18;
      speedstore[uVar8].stamp = newer;
      if (9 < speedindex) {
        indexwrapped = '\x01';
        speedindex = 0;
      }
      if (indexwrapped == '\x01') {
        lVar9 = tvdiff(newer,speedstore[speedindex].stamp);
        lVar13 = cVar18 - speedstore[speedindex].ul;
        lVar10 = cVar16 - speedstore[speedindex].dl;
      }
      else {
        lVar9 = tvdiff(newer,*start);
        lVar13 = cVar18;
        lVar10 = cVar16;
      }
      lVar10 = (long)((double)lVar10 / ((double)lVar9 / 1000.0));
      lVar13 = (long)((double)lVar13 / ((double)lVar9 / 1000.0));
      if (lVar13 < lVar10) {
        lVar13 = lVar10;
      }
      if ((bool)(bVar4 & lVar13 != 0)) {
        lVar10 = all_dltotal / lVar13;
        time2str(time_left,(all_dltotal - cVar16) / lVar13);
        time2str(time_total,lVar10);
      }
      else {
        builtin_strncpy(time_left,"--:--:--",9);
        builtin_strncpy(time_total,"--:--:--",9);
      }
      time2str(time_spent,lVar6 / 1000);
      pFVar1 = global->errors;
      max5data(cVar16,buffer[0]);
      max5data(cVar18,buffer[1]);
      cVar16 = all_xfers;
      max5data(lVar13,buffer[2]);
      pcVar14 = "";
      if (final) {
        pcVar14 = "\n";
      }
      curl_mfprintf(pFVar1,"\r%-3s %-3s %s %s %5ld %5ld %5ld %s %s %s %s %5s",dlpercen,ulpercen,
                    buffer,buffer + 1,cVar16,lVar15,lVar17,time_total,time_spent,time_left,
                    buffer + 2,pcVar14);
      _Var5 = true;
    }
    else {
      _Var5 = false;
    }
    return _Var5;
  }
  return false;
}

Assistant:

bool progress_meter(struct GlobalConfig *global,
                    struct timeval *start,
                    bool final)
{
  static struct timeval stamp;
  static bool header = FALSE;
  struct timeval now;
  long diff;

  if(global->noprogress)
    return FALSE;

  now = tvnow();
  diff = tvdiff(now, stamp);

  if(!header) {
    header = TRUE;
    fputs("DL% UL%  Dled  Uled  Xfers  Live   Qd "
          "Total     Current  Left    Speed\n",
          global->errors);
  }
  if(final || (diff > 500)) {
    char time_left[10];
    char time_total[10];
    char time_spent[10];
    char buffer[3][6];
    curl_off_t spent = tvdiff(now, *start)/1000;
    char dlpercen[4]="--";
    char ulpercen[4]="--";
    struct per_transfer *per;
    curl_off_t all_dlnow = 0;
    curl_off_t all_ulnow = 0;
    bool dlknown = TRUE;
    bool ulknown = TRUE;
    curl_off_t all_running = 0; /* in progress */
    curl_off_t all_queued = 0;  /* pending */
    curl_off_t speed = 0;
    unsigned int i;
    stamp = now;

    /* first add the amounts of the already completed transfers */
    all_dlnow += all_dlalready;
    all_ulnow += all_ulalready;

    for(per = transfers; per; per = per->next) {
      all_dlnow += per->dlnow;
      all_ulnow += per->ulnow;
      if(!per->dltotal)
        dlknown = FALSE;
      else if(!per->dltotal_added) {
        /* only add this amount once */
        all_dltotal += per->dltotal;
        per->dltotal_added = TRUE;
      }
      if(!per->ultotal)
        ulknown = FALSE;
      else if(!per->ultotal_added) {
        /* only add this amount once */
        all_ultotal += per->ultotal;
        per->ultotal_added = TRUE;
      }
      if(!per->added)
        all_queued++;
      else
        all_running++;
    }
    if(dlknown && all_dltotal)
      /* TODO: handle integer overflow */
      msnprintf(dlpercen, sizeof(dlpercen), "%3d",
                all_dlnow * 100 / all_dltotal);
    if(ulknown && all_ultotal)
      /* TODO: handle integer overflow */
      msnprintf(ulpercen, sizeof(ulpercen), "%3d",
                all_ulnow * 100 / all_ultotal);

    /* get the transfer speed, the higher of the two */

    i = speedindex;
    speedstore[i].dl = all_dlnow;
    speedstore[i].ul = all_ulnow;
    speedstore[i].stamp = now;
    if(++speedindex >= SPEEDCNT) {
      indexwrapped = TRUE;
      speedindex = 0;
    }

    {
      long deltams;
      curl_off_t dl;
      curl_off_t ul;
      curl_off_t dls;
      curl_off_t uls;
      if(indexwrapped) {
        /* 'speedindex' is the oldest stored data */
        deltams = tvdiff(now, speedstore[speedindex].stamp);
        dl = all_dlnow - speedstore[speedindex].dl;
        ul = all_ulnow - speedstore[speedindex].ul;
      }
      else {
        /* since the beginning */
        deltams = tvdiff(now, *start);
        dl = all_dlnow;
        ul = all_ulnow;
      }
      dls = (curl_off_t)((double)dl / ((double)deltams/1000.0));
      uls = (curl_off_t)((double)ul / ((double)deltams/1000.0));
      speed = dls > uls ? dls : uls;
    }


    if(dlknown && speed) {
      curl_off_t est = all_dltotal / speed;
      curl_off_t left = (all_dltotal - all_dlnow) / speed;
      time2str(time_left, left);
      time2str(time_total, est);
    }
    else {
      time2str(time_left, 0);
      time2str(time_total, 0);
    }
    time2str(time_spent, spent);

    fprintf(global->errors,
            "\r"
            "%-3s " /* percent downloaded */
            "%-3s " /* percent uploaded */
            "%s " /* Dled */
            "%s " /* Uled */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Xfers */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Live */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Queued */
            "%s "  /* Total time */
            "%s "  /* Current time */
            "%s "  /* Time left */
            "%s "  /* Speed */
            "%5s" /* final newline */,

            dlpercen,  /* 3 letters */
            ulpercen,  /* 3 letters */
            max5data(all_dlnow, buffer[0]),
            max5data(all_ulnow, buffer[1]),
            all_xfers,
            all_running,
            all_queued,
            time_total,
            time_spent,
            time_left,
            max5data(speed, buffer[2]), /* speed */
            final ? "\n" :"");
    return TRUE;
  }
  return FALSE;
}